

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_bool32 ma_dr_flac__read_subframe_header(ma_dr_flac_bs *bs,ma_dr_flac_subframe *pSubframe)

{
  ma_uint32 mVar1;
  ulong uVar2;
  byte bVar3;
  ma_bool32 mVar4;
  undefined8 in_RAX;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  char cVar9;
  int iVar10;
  bool bVar11;
  ma_uint8 header;
  
  header = (ma_uint8)((ulong)in_RAX >> 0x38);
  mVar4 = ma_dr_flac__read_uint8(bs,8,&header);
  if ((-1 < (char)header & (byte)mVar4) != 1) {
    return 0;
  }
  pSubframe->lpcOrder = '\0';
  bVar3 = header >> 1;
  if (bVar3 == 1) {
    pSubframe->subframeType = '\x01';
  }
  else if (bVar3 == 0) {
    pSubframe->subframeType = '\0';
  }
  else if (header < 0x40) {
    if ((header & 0x10) == 0) {
      pSubframe->subframeType = 0xff;
      return 0;
    }
    pSubframe->subframeType = '\b';
    pSubframe->lpcOrder = bVar3 & 7;
    if (4 < (bVar3 & 7)) {
      pSubframe->subframeType = 0xff;
      pSubframe->lpcOrder = '\0';
      return 0;
    }
  }
  else {
    pSubframe->subframeType = ' ';
    pSubframe->lpcOrder = (bVar3 & 0x1f) + 1;
  }
  pSubframe->wastedBitsPerSample = '\0';
  mVar4 = 1;
  if ((header & 1) != 0) {
    iVar10 = 0;
    do {
      uVar2 = bs->cache;
      if (uVar2 != 0) {
        if (uVar2 == 1) {
          mVar1 = bs->consumedBits;
          mVar4 = ma_dr_flac__reload_cache(bs);
          if (mVar4 == 0) break;
          cVar9 = ((char)iVar10 - (char)mVar1) + '?';
        }
        else {
          if (ma_dr_flac__gIsLZCNTSupported == 0) {
            if (uVar2 >> 0x3c == 0) {
              bVar11 = uVar2 >> 0x20 == 0;
              uVar7 = uVar2 << 0x20;
              if (!bVar11) {
                uVar7 = uVar2;
              }
              iVar8 = (uint)bVar11 * 0x20;
              iVar6 = iVar8 + 0x10;
              uVar2 = uVar7 << 0x10;
              if (uVar7 >> 0x30 != 0) {
                iVar6 = iVar8;
                uVar2 = uVar7;
              }
              iVar8 = iVar6 + 8;
              uVar7 = uVar2 << 8;
              if (uVar2 >> 0x38 != 0) {
                iVar8 = iVar6;
                uVar7 = uVar2;
              }
              iVar6 = iVar8 + 4;
              uVar2 = uVar7 << 4;
              if (0xfffffffffffffff < uVar7) {
                iVar6 = iVar8;
                uVar2 = uVar7;
              }
              iVar6 = iVar6 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                      (uVar2 >> 0x3c) * 4);
            }
            else {
              iVar6 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                              (uVar2 >> 0x3c) * 4);
            }
            iVar6 = iVar6 + -1;
          }
          else {
            iVar6 = (int)LZCOUNT(uVar2);
          }
          uVar5 = iVar6 + 1;
          if (0x40 - (ulong)bs->consumedBits < (ulong)uVar5) break;
          bs->consumedBits = bs->consumedBits + uVar5;
          bs->cache = bs->cache << ((byte)uVar5 & 0x3f);
          cVar9 = (char)iVar6 + (char)iVar10;
        }
        pSubframe->wastedBitsPerSample = cVar9 + '\x01';
        return 1;
      }
      iVar10 = (iVar10 - bs->consumedBits) + 0x40;
      mVar4 = ma_dr_flac__reload_cache(bs);
    } while (mVar4 != 0);
    mVar4 = 0;
  }
  return mVar4;
}

Assistant:

static ma_bool32 ma_dr_flac__read_subframe_header(ma_dr_flac_bs* bs, ma_dr_flac_subframe* pSubframe)
{
    ma_uint8 header;
    int type;
    if (!ma_dr_flac__read_uint8(bs, 8, &header)) {
        return MA_FALSE;
    }
    if ((header & 0x80) != 0) {
        return MA_FALSE;
    }
    pSubframe->lpcOrder = 0;
    type = (header & 0x7E) >> 1;
    if (type == 0) {
        pSubframe->subframeType = MA_DR_FLAC_SUBFRAME_CONSTANT;
    } else if (type == 1) {
        pSubframe->subframeType = MA_DR_FLAC_SUBFRAME_VERBATIM;
    } else {
        if ((type & 0x20) != 0) {
            pSubframe->subframeType = MA_DR_FLAC_SUBFRAME_LPC;
            pSubframe->lpcOrder = (ma_uint8)(type & 0x1F) + 1;
        } else if ((type & 0x08) != 0) {
            pSubframe->subframeType = MA_DR_FLAC_SUBFRAME_FIXED;
            pSubframe->lpcOrder = (ma_uint8)(type & 0x07);
            if (pSubframe->lpcOrder > 4) {
                pSubframe->subframeType = MA_DR_FLAC_SUBFRAME_RESERVED;
                pSubframe->lpcOrder = 0;
            }
        } else {
            pSubframe->subframeType = MA_DR_FLAC_SUBFRAME_RESERVED;
        }
    }
    if (pSubframe->subframeType == MA_DR_FLAC_SUBFRAME_RESERVED) {
        return MA_FALSE;
    }
    pSubframe->wastedBitsPerSample = 0;
    if ((header & 0x01) == 1) {
        unsigned int wastedBitsPerSample;
        if (!ma_dr_flac__seek_past_next_set_bit(bs, &wastedBitsPerSample)) {
            return MA_FALSE;
        }
        pSubframe->wastedBitsPerSample = (ma_uint8)wastedBitsPerSample + 1;
    }
    return MA_TRUE;
}